

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void common_batch_add(llama_batch *batch,llama_token id,llama_pos pos,
                     vector<int,_std::allocator<int>_> *seq_ids,bool logits)

{
  llama_seq_id **pplVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  long lVar5;
  
  pplVar1 = batch->seq_id;
  if (pplVar1[batch->n_tokens] != (llama_seq_id *)0x0) {
    batch->token[batch->n_tokens] = id;
    batch->pos[batch->n_tokens] = pos;
    piVar2 = (seq_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (seq_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    lVar4 = (long)piVar3 - (long)piVar2 >> 2;
    batch->n_seq_id[batch->n_tokens] = (int32_t)lVar4;
    if (piVar3 != piVar2) {
      lVar5 = 0;
      do {
        pplVar1[batch->n_tokens][lVar5] = piVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    }
    batch->logits[batch->n_tokens] = logits;
    batch->n_tokens = batch->n_tokens + 1;
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
             ,0x487,"GGML_ASSERT(%s) failed",
             "batch.seq_id[batch.n_tokens] && \"llama_batch size exceeded\"");
}

Assistant:

void common_batch_add(
                 struct llama_batch & batch,
                        llama_token   id,
                          llama_pos   pos,
    const std::vector<llama_seq_id> & seq_ids,
                               bool   logits) {
    GGML_ASSERT(batch.seq_id[batch.n_tokens] && "llama_batch size exceeded");

    batch.token   [batch.n_tokens] = id;
    batch.pos     [batch.n_tokens] = pos;
    batch.n_seq_id[batch.n_tokens] = seq_ids.size();
    for (size_t i = 0; i < seq_ids.size(); ++i) {
        batch.seq_id[batch.n_tokens][i] = seq_ids[i];
    }
    batch.logits  [batch.n_tokens] = logits;

    batch.n_tokens++;
}